

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_selist.c
# Opt level: O3

void test_mapreduce(CuTest *tc)

{
  int result;
  int buffer;
  selist *ql;
  int local_30;
  undefined1 local_2c [4];
  selist *local_28;
  
  local_30 = 0;
  local_28 = (selist *)0x0;
  selist_push(&local_28,
              "Lorem ipsum dolor sit amet, consectetur adipisicing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua."
             );
  selist_push(&local_28,
              "Lorem ipsum dolor sit amet, consectetur adipisicing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua."
             );
  selist_map_reduce(local_28,my_map,my_reduce,local_2c,&local_30);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c",
             0x1d,(char *)0x0,0x98,local_30);
  selist_free(local_28);
  return;
}

Assistant:

static void test_mapreduce(CuTest * tc)
{
    int buffer;
    int result = 0;
    struct selist *ql = NULL;
    selist_push(&ql, (void *)lipsum);
    selist_push(&ql, (void *)lipsum);
    selist_map_reduce(ql, my_map, my_reduce, &buffer, &result);
    CuAssertIntEquals(tc, 152, result);
    selist_free(ql);
}